

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O1

bool trim(string *s)

{
  char *pcVar1;
  char *pcVar2;
  pointer pcVar3;
  ulong uVar4;
  void *pvVar5;
  char *pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  long lVar9;
  char *pcVar10;
  
  uVar4 = std::__cxx11::string::find((char)s,0x23);
  if (uVar4 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)s,uVar4);
  }
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar4 = s->_M_string_length;
  pcVar1 = pcVar2 + uVar4;
  pcVar6 = pcVar2;
  if (0 < (long)uVar4 >> 2) {
    pcVar6 = pcVar2 + (uVar4 & 0xfffffffffffffffc);
    lVar9 = ((long)uVar4 >> 2) + 1;
    pcVar10 = pcVar2 + 3;
    do {
      pvVar5 = memchr(" \t\r\n",(int)pcVar10[-3],5);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_0010a64c;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar10[-2],5);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_0010a64c;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar10[-1],5);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_0010a64c;
      }
      pvVar5 = memchr(" \t\r\n",(int)*pcVar10,5);
      if (pvVar5 == (void *)0x0) goto LAB_0010a64c;
      lVar9 = lVar9 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar1 - (long)pcVar6;
  if (lVar9 == 1) {
LAB_0010a618:
    pvVar5 = memchr(" \t\r\n",(int)*pcVar6,5);
    pcVar10 = pcVar6;
    if (pvVar5 != (void *)0x0) {
      pcVar10 = pcVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_0010a5fb:
    pvVar5 = memchr(" \t\r\n",(int)*pcVar6,5);
    pcVar10 = pcVar6;
    if (pvVar5 != (void *)0x0) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0010a618;
    }
  }
  else {
    pcVar10 = pcVar1;
    if ((lVar9 == 3) &&
       (pvVar5 = memchr(" \t\r\n",(int)*pcVar6,5), pcVar10 = pcVar6, pvVar5 != (void *)0x0)) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0010a5fb;
    }
  }
LAB_0010a64c:
  if (pcVar1 == pcVar10) {
    s->_M_string_length = 0;
    *pcVar2 = '\0';
  }
  else {
    std::__cxx11::string::_M_erase((ulong)s,0);
  }
  pcVar3 = (s->_M_dataplus)._M_p;
  pcVar8 = pcVar3 + s->_M_string_length;
  lVar9 = (long)s->_M_string_length >> 2;
  pcVar7 = pcVar8;
  if (0 < lVar9) {
    pcVar7 = pcVar8 + lVar9 * -4;
    lVar9 = lVar9 + 1;
    do {
      pvVar5 = memchr(" \t\r\n",(int)pcVar8[-1],5);
      if (pvVar5 == (void *)0x0) goto LAB_0010a7ab;
      pvVar5 = memchr(" \t\r\n",(int)pcVar8[-2],5);
      if (pvVar5 == (void *)0x0) {
        pcVar8 = pcVar8 + -1;
        goto LAB_0010a7ab;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar8[-3],5);
      if (pvVar5 == (void *)0x0) {
        pcVar8 = pcVar8 + -2;
        goto LAB_0010a7ab;
      }
      pvVar5 = memchr(" \t\r\n",(int)pcVar8[-4],5);
      if (pvVar5 == (void *)0x0) {
        pcVar8 = pcVar8 + -3;
        goto LAB_0010a7ab;
      }
      pcVar8 = pcVar8 + -4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar7 - (long)pcVar3;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      pcVar8 = pcVar3;
      if ((lVar9 != 3) ||
         (pvVar5 = memchr(" \t\r\n",(int)pcVar7[-1],5), pcVar8 = pcVar7, pvVar5 == (void *)0x0))
      goto LAB_0010a7ab;
      pcVar7 = pcVar7 + -1;
    }
    pvVar5 = memchr(" \t\r\n",(int)pcVar7[-1],5);
    pcVar8 = pcVar7;
    if (pvVar5 == (void *)0x0) goto LAB_0010a7ab;
    pcVar7 = pcVar7 + -1;
  }
  pvVar5 = memchr(" \t\r\n",(int)pcVar7[-1],5);
  pcVar8 = pcVar7;
  if (pvVar5 != (void *)0x0) {
    pcVar8 = pcVar3;
  }
LAB_0010a7ab:
  s->_M_string_length = (long)pcVar8 - (long)pcVar3;
  *pcVar8 = '\0';
  return s->_M_string_length != 0;
}

Assistant:

bool trim(string& s)
{
	size_t pos;
	pos = s.find('#');
	if (pos != string::npos)
		s.erase(pos, s.size() - pos);

	// remove leading whitespace
	s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
		return !_isspace(ch);
	}));

	// remove trailing whitespace
	s.erase(std::find_if(s.rbegin(), s.rend(), [](int ch) {
		return !_isspace(ch);
	}).base(), s.end());

	return !s.empty();
}